

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu_helper.c
# Opt level: O1

_Bool ppc_cpu_tlb_fill_ppc64
                (CPUState *cs,vaddr addr,int size,MMUAccessType access_type,int mmu_idx,_Bool probe,
                uintptr_t retaddr)

{
  byte *pbVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  hwaddr hVar8;
  long lVar9;
  char *fmt;
  CPUPPCState_conflict2 *env;
  int access_type_00;
  int iVar10;
  mmu_ctx_t_conflict local_68;
  
  env = (CPUPPCState_conflict2 *)(cs[1].tb_jmp_cache + 0x359);
  if (cs[3].tb_jmp_cache[0xa72] != (TranslationBlock *)0x0) {
    iVar4 = (*(code *)cs[3].tb_jmp_cache[0xa72])(cs,addr,access_type,mmu_idx);
    goto switchD_00b6bd4c_default;
  }
  if (access_type == MMU_INST_FETCH) {
    access_type_00 = 0x10;
    access_type = MMU_DATA_LOAD;
  }
  else {
    access_type_00 = *(int *)(cs[1].tb_jmp_cache + 0x3b0);
  }
  iVar5 = get_physical_address_wtlb(env,&local_68,addr,access_type,access_type_00,mmu_idx);
  if (iVar5 == 0) {
    tlb_set_page_ppc64(cs,addr & 0xfffffffffffff000,local_68.raddr & 0xfffffffffffff000,
                       local_68.prot,mmu_idx,0x1000);
    iVar4 = 0;
    goto switchD_00b6bd4c_default;
  }
  iVar4 = iVar5;
  if (-1 < iVar5) goto switchD_00b6bd4c_default;
  iVar10 = 1;
  iVar4 = 1;
  if (access_type_00 == 0x10) {
    switch(iVar5) {
    case -3:
      if (((ulong)cs[3].tb_jmp_cache[0x8d8] & 0xfffffffe) == 8) {
        cs[1].tb_jmp_cache[0x4fa] = (TranslationBlock *)0x0;
      }
    case -4:
      cs->exception_index = 3;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0x10000000;
      break;
    case -2:
      cs->exception_index = 3;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0x8000000;
      break;
    case -1:
      switch(*(undefined4 *)(cs[3].tb_jmp_cache + 0x8d8)) {
      case 2:
        cs->exception_index = 0x4e;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0x40000;
        lVar7 = 0xc780;
        lVar9 = 0xc778;
        break;
      case 3:
        cs->exception_index = 0x4e;
LAB_00b6c175:
        *(int *)(cs[3].tb_jmp_cache + 0x8dd) = local_68.key << 0x13;
        cs[1].tb_jmp_cache[0x890] =
             (TranslationBlock *)
             ((long)*(int *)(cs[1].tb_jmp_cache + 0x4b3) - 1U &
              (long)*(int *)((long)cs[1].tb_jmp_cache + 0x259c) + 1U | addr & 0xfffffffffffffffc);
        cs[1].tb_jmp_cache[0x891] = (TranslationBlock *)(local_68.ptem | 0x80000000);
        goto switchD_00b6bd4c_default;
      case 4:
      case 5:
        cs->exception_index = 0xe;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
        cs[1].tb_jmp_cache[0x891] = (TranslationBlock *)addr;
LAB_00b6bec8:
        cs[1].tb_jmp_cache[0x890] = (TranslationBlock *)0x0;
        goto switchD_00b6bd4c_default;
      case 6:
switchD_00b6bdb9_caseD_6:
        fmt = "PowerPC in real mode should never raise any MMU exceptions\n";
LAB_00b6c1fd:
        cpu_abort_ppc64(cs,fmt);
      case 7:
switchD_00b6bdb9_caseD_7:
        fmt = "MPC8xx MMU model is not implemented\n";
        goto LAB_00b6c1fd;
      case 9:
        booke206_update_mas_tlb_miss(env,addr,2,mmu_idx);
      case 8:
        cs->exception_index = 0xe;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
        cs[1].tb_jmp_cache[0x4f9] = (TranslationBlock *)addr;
        cs[1].tb_jmp_cache[0x4fa] = (TranslationBlock *)((ulong)((mmu_idx & 0xfffffffeU) == 8) << 6)
        ;
LAB_00b6c096:
        iVar4 = -1;
        goto switchD_00b6bd4c_default;
      default:
switchD_00b6bdb9_default:
        fmt = "Unknown or invalid MMU model\n";
        goto LAB_00b6c1fd;
      }
      goto LAB_00b6c0bf;
    }
  }
  else {
    if (iVar5 == -4) {
      if (access_type_00 == 0x50) {
        cs->exception_index = 2;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
        cs[1].tb_jmp_cache[0x4cf] = (TranslationBlock *)addr;
        if (access_type == MMU_DATA_STORE) {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x6100000;
          iVar4 = iVar10;
        }
        else {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x4100000;
          iVar4 = iVar10;
        }
      }
      else if (access_type_00 == 0x40) {
        cs->exception_index = 2;
        *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
        cs[1].tb_jmp_cache[0x4cf] = (TranslationBlock *)addr;
        if (access_type == MMU_DATA_STORE) {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x6000000;
        }
        else {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x4000000;
        }
      }
      else {
        if (access_type_00 == 0x30) {
          cs->exception_index = 5;
          *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 1;
        }
        else {
          printf("DSI: invalid exception (%d)\n",0xfffffffc);
          cs->exception_index = 6;
          *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0x21;
        }
        cs[1].tb_jmp_cache[0x4cf] = (TranslationBlock *)addr;
        iVar4 = iVar10;
      }
      goto switchD_00b6bd4c_default;
    }
    if (iVar5 == -2) {
      cs->exception_index = 2;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
      if (*(int *)(cs[3].tb_jmp_cache + 0x8d8) - 8U < 2) {
        cs[1].tb_jmp_cache[0x4f9] = (TranslationBlock *)addr;
        uVar6 = (uint)(access_type != MMU_DATA_LOAD) * 0x800000;
        uVar3 = uVar6 + 0x40;
        if ((mmu_idx & 0xfffffffeU) != 8) {
          uVar3 = uVar6;
        }
        cs[1].tb_jmp_cache[0x4fa] = (TranslationBlock *)(ulong)uVar3;
      }
      else if (*(int *)(cs[3].tb_jmp_cache + 0x8d8) - 4U < 2) {
        cs[1].tb_jmp_cache[0x891] = (TranslationBlock *)addr;
        if (access_type != MMU_DATA_LOAD) {
          pbVar1 = (byte *)((long)cs[1].tb_jmp_cache + 0x4482);
          *pbVar1 = *pbVar1 | 0x80;
        }
      }
      else {
        cs[1].tb_jmp_cache[0x4cf] = (TranslationBlock *)addr;
        if (access_type == MMU_DATA_STORE) {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0xa000000;
        }
        else {
          cs[1].tb_jmp_cache[0x4ce] = (TranslationBlock *)0x8000000;
        }
      }
      goto switchD_00b6bd4c_default;
    }
    if (iVar5 != -1) goto switchD_00b6bd4c_default;
    switch(*(undefined4 *)(cs[3].tb_jmp_cache + 0x8d8)) {
    case 2:
      cs->exception_index = (access_type == MMU_DATA_STORE) + 0x4f;
      *(uint *)(cs[3].tb_jmp_cache + 0x8dd) = (uint)(access_type == MMU_DATA_STORE) << 0x10;
      lVar7 = 0xc760;
      lVar9 = 0xc758;
      break;
    case 3:
      if (access_type == MMU_DATA_STORE) {
        cs->exception_index = 0x50;
      }
      else {
        cs->exception_index = 0x4f;
      }
      goto LAB_00b6c175;
    case 4:
    case 5:
      cs->exception_index = 0xd;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
      cs[1].tb_jmp_cache[0x891] = (TranslationBlock *)addr;
      if (access_type != MMU_DATA_LOAD) {
        cs[1].tb_jmp_cache[0x890] = (TranslationBlock *)0x800000;
        goto switchD_00b6bd4c_default;
      }
      goto LAB_00b6bec8;
    case 6:
      goto switchD_00b6bdb9_caseD_6;
    case 7:
      goto switchD_00b6bdb9_caseD_7;
    case 9:
      booke206_update_mas_tlb_miss(env,addr,access_type,mmu_idx);
    case 8:
      cs->exception_index = 0xd;
      *(undefined4 *)(cs[3].tb_jmp_cache + 0x8dd) = 0;
      cs[1].tb_jmp_cache[0x4f9] = (TranslationBlock *)addr;
      uVar6 = (uint)(access_type != MMU_DATA_LOAD) * 0x800000;
      uVar3 = uVar6 + 0x40;
      if ((mmu_idx & 0xfffffffeU) != 8) {
        uVar3 = uVar6;
      }
      cs[1].tb_jmp_cache[0x4fa] = (TranslationBlock *)(ulong)uVar3;
      goto LAB_00b6c096;
    default:
      goto switchD_00b6bdb9_default;
    }
LAB_00b6c0bf:
    *(vaddr *)((long)cs->jmp_env[0].__jmpbuf + lVar9 + -0x40) = addr;
    *(target_ulong *)((long)cs->jmp_env[0].__jmpbuf + lVar7 + -0x40) = local_68.ptem | 0x80000000;
    *(uint *)(cs[3].tb_jmp_cache + 0x8dd) =
         *(uint *)(cs[3].tb_jmp_cache + 0x8dd) | local_68.key << 0x13;
    uVar2 = *(ushort *)((long)cs[1].tb_jmp_cache + 0x26aa);
    hVar8 = get_pteg_offset32_ppc64((PowerPCCPU_conflict3 *)cs,local_68.hash[0]);
    cs[1].tb_jmp_cache[0x88e] = (TranslationBlock *)(hVar8 + (ulong)uVar2 * 0x10000);
    uVar2 = *(ushort *)((long)cs[1].tb_jmp_cache + 0x26aa);
    hVar8 = get_pteg_offset32_ppc64((PowerPCCPU_conflict3 *)cs,local_68.hash[1]);
    cs[1].tb_jmp_cache[0x88f] = (TranslationBlock *)(hVar8 + (ulong)uVar2 * 0x10000);
    iVar4 = 1;
  }
switchD_00b6bd4c_default:
  if ((iVar4 != 0) && (!probe)) {
    raise_exception_err_ra_ppc64
              (env,cs->exception_index,*(uint32_t *)(cs[3].tb_jmp_cache + 0x8dd),retaddr);
  }
  return iVar4 == 0;
}

Assistant:

bool ppc_cpu_tlb_fill(CPUState *cs, vaddr addr, int size,
                      MMUAccessType access_type, int mmu_idx,
                      bool probe, uintptr_t retaddr)
{
    PowerPCCPU *cpu = POWERPC_CPU(cs);
    PowerPCCPUClass *pcc = POWERPC_CPU_GET_CLASS(cs);
    CPUPPCState *env = &cpu->env;
    int ret;

    if (pcc->handle_mmu_fault) {
        ret = pcc->handle_mmu_fault(cpu, addr, access_type, mmu_idx);
    } else {
        ret = cpu_ppc_handle_mmu_fault(env, addr, access_type, mmu_idx);
    }
    if (unlikely(ret != 0)) {
        if (probe) {
            return false;
        }
        raise_exception_err_ra(env, cs->exception_index, env->error_code,
                               retaddr);
    }
    return true;
}